

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O0

int __thiscall soplex::LPRowSetBase<double>::remove(LPRowSetBase<double> *this,char *__filename)

{
  double dVar1;
  int iVar2;
  int extraout_EAX;
  double *pdVar3;
  int *piVar4;
  int n;
  VectorBase<double> *in_stack_ffffffffffffff90;
  DataArray<int> *this_00;
  DataArray<int> *this_01;
  undefined4 in_stack_ffffffffffffffc0;
  
  SVSetBase<double>::remove(&this->super_SVSetBase<double>,(char *)((ulong)__filename & 0xffffffff))
  ;
  n = (int)((ulong)&this->left >> 0x20);
  num((LPRowSetBase<double> *)0x266fb5);
  pdVar3 = VectorBase<double>::operator[](in_stack_ffffffffffffff90,n);
  this_00 = (DataArray<int> *)*pdVar3;
  pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,n);
  *pdVar3 = (double)this_00;
  num((LPRowSetBase<double> *)0x266ffe);
  pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,n);
  dVar1 = *pdVar3;
  pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,n);
  *pdVar3 = dVar1;
  num((LPRowSetBase<double> *)0x26704b);
  pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,n);
  dVar1 = *pdVar3;
  pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,n);
  *pdVar3 = dVar1;
  this_01 = &this->scaleExp;
  iVar2 = num((LPRowSetBase<double> *)0x267098);
  piVar4 = DataArray<int>::operator[](this_01,iVar2);
  iVar2 = *piVar4;
  piVar4 = DataArray<int>::operator[](&this->scaleExp,(int)__filename);
  *piVar4 = iVar2;
  num((LPRowSetBase<double> *)0x2670db);
  VectorBase<double>::reDim
            ((VectorBase<double> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
             (int)((ulong)this_01 >> 0x20),SUB81((ulong)this_01 >> 0x18,0));
  num((LPRowSetBase<double> *)0x267104);
  VectorBase<double>::reDim
            ((VectorBase<double> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
             (int)((ulong)this_01 >> 0x20),SUB81((ulong)this_01 >> 0x18,0));
  num((LPRowSetBase<double> *)0x26712d);
  VectorBase<double>::reDim
            ((VectorBase<double> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
             (int)((ulong)this_01 >> 0x20),SUB81((ulong)this_01 >> 0x18,0));
  num((LPRowSetBase<double> *)0x267156);
  DataArray<int>::reSize(this_00,n);
  return extraout_EAX;
}

Assistant:

void remove(int i)
   {
      SVSetBase<R>::remove(i);
      left[i] = left[num()];
      right[i] = right[num()];
      object[i] = object[num()];
      scaleExp[i] = scaleExp[num()];
      left.reDim(num());
      right.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }